

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_sub(lua_State *L)

{
  size_t in_RAX;
  char *pcVar1;
  lua_Integer pos;
  size_t sVar2;
  size_t sVar3;
  size_t in_RCX;
  size_t l;
  
  l = in_RAX;
  pcVar1 = luaL_checklstring(L,1,&l);
  pos = luaL_checkinteger(L,2);
  sVar2 = posrelatI(pos,l);
  sVar3 = getendpos(L,-1,l,in_RCX);
  if (sVar3 < sVar2) {
    lua_pushstring(L,"");
  }
  else {
    lua_pushlstring(L,pcVar1 + (sVar2 - 1),(sVar3 - sVar2) + 1);
  }
  return 1;
}

Assistant:

static int str_sub (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  size_t start = posrelatI(luaL_checkinteger(L, 2), l);
  size_t end = getendpos(L, 3, -1, l);
  if (start <= end)
    lua_pushlstring(L, s + start - 1, (end - start) + 1);
  else lua_pushliteral(L, "");
  return 1;
}